

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

ssize_t uv_wtf8_length_as_utf16(char *source_ptr)

{
  char cVar1;
  int32_t iVar2;
  long lStack_20;
  int32_t code_point;
  size_t w_target_len;
  char *source_ptr_local;
  
  lStack_20 = 0;
  w_target_len = (size_t)source_ptr;
  do {
    iVar2 = uv__wtf8_decode1((char **)&w_target_len);
    if (iVar2 < 0) {
      return -1;
    }
    if (0xffff < iVar2) {
      lStack_20 = lStack_20 + 1;
    }
    lStack_20 = lStack_20 + 1;
    cVar1 = *(char *)w_target_len;
    w_target_len = w_target_len + 1;
  } while (cVar1 != '\0');
  return lStack_20;
}

Assistant:

ssize_t uv_wtf8_length_as_utf16(const char* source_ptr) {
  size_t w_target_len = 0;
  int32_t code_point;

  do {
    code_point = uv__wtf8_decode1(&source_ptr);
    if (code_point < 0)
      return -1;
    if (code_point > 0xFFFF)
      w_target_len++;
    w_target_len++;
  } while (*source_ptr++);

  return w_target_len;
}